

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ReturnStmt *stmt)

{
  undefined1 *puVar1;
  ostream *poVar2;
  string_view sVar3;
  string local_60;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->generator_->debug == true) {
    (stmt->super_Stmt).super_IRNode.verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  sVar3 = indent(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar3._M_str,
                      sVar3._M_len);
  poVar2 = std::operator<<(poVar2,"return ");
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&(stmt->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  Stream::var_str_abi_cxx11_(&local_60,&this->stream_,local_40._M_ptr);
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  poVar2 = std::operator<<(poVar2,";");
  puVar1 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::ReturnStmt* stmt) {
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << "return " << stream_.var_str(stmt->value().get()) << ";"
            << stream_.endl();
}